

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall Rml::ElementScroll::FormatScrollbars(ElementScroll *this)

{
  Element *pEVar1;
  pointer pWVar2;
  float *pfVar3;
  ComputedValues *this_00;
  Box *pBVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Property local_138;
  Vector2f local_e4;
  Vector2<float> local_dc;
  Vector2f local_d4;
  Vector2<float> local_cc;
  Vector2<float> local_c4;
  Vector2<float> local_bc;
  Vector2f local_b4 [2];
  Vector2f local_a0;
  undefined1 local_98 [8];
  Box corner_box;
  Vector2f local_54;
  Vector2f local_4c;
  Vector2f offset;
  int variable_axis;
  float min_scrollbar_margin;
  float user_scrollbar_margin;
  float slider_length;
  float traversable_track_1;
  float traversable_track;
  int i;
  Vector2f containing_block;
  Box *element_box;
  ElementScroll *this_local;
  
  containing_block = (Vector2f)Element::GetBox(this->element);
  _traversable_track = Box::GetSize((Box *)containing_block,Padding);
  for (traversable_track_1 = 0.0; (int)traversable_track_1 < 2;
      traversable_track_1 = (float)((int)traversable_track_1 + 1)) {
    if ((this->scrollbars[(int)traversable_track_1].enabled & 1U) != 0) {
      if (traversable_track_1 == 0.0) {
        pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                 operator->(&this->scrollbars[0].widget);
        fVar5 = Element::GetClientHeight(this->element);
        WidgetScroll::SetBarLength(pWVar2,fVar5);
        pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                 operator->(&this->scrollbars[0].widget);
        fVar5 = Element::GetScrollHeight(this->element);
        WidgetScroll::SetTrackLength(pWVar2,fVar5);
        fVar5 = Element::GetScrollHeight(this->element);
        fVar6 = Element::GetClientHeight(this->element);
        if (fVar5 - fVar6 <= 0.0) {
          pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                   operator->(&this->scrollbars[0].widget);
          WidgetScroll::SetBarPosition(pWVar2,0.0);
        }
        else {
          pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                   operator->(&this->scrollbars[0].widget);
          fVar7 = Element::GetScrollTop(this->element);
          WidgetScroll::SetBarPosition(pWVar2,fVar7 / (fVar5 - fVar6));
        }
      }
      else {
        pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                 operator->(&this->scrollbars[(int)traversable_track_1].widget);
        fVar5 = Element::GetClientWidth(this->element);
        WidgetScroll::SetBarLength(pWVar2,fVar5);
        pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                 operator->(&this->scrollbars[(int)traversable_track_1].widget);
        fVar5 = Element::GetScrollWidth(this->element);
        WidgetScroll::SetTrackLength(pWVar2,fVar5);
        fVar5 = Element::GetScrollWidth(this->element);
        fVar6 = Element::GetClientWidth(this->element);
        if (fVar5 - fVar6 <= 0.0) {
          pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                   operator->(&this->scrollbars[(int)traversable_track_1].widget);
          WidgetScroll::SetBarPosition(pWVar2,0.0);
        }
        else {
          pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
                   operator->(&this->scrollbars[(int)traversable_track_1].widget);
          fVar7 = Element::GetScrollLeft(this->element);
          WidgetScroll::SetBarPosition(pWVar2,fVar7 / (fVar5 - fVar6));
        }
      }
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&traversable_track);
      fVar5 = pfVar3[1 - (int)traversable_track_1];
      this_00 = Element::GetComputedValues(this->scrollbars[(int)traversable_track_1].element);
      fVar6 = Style::ComputedValues::scrollbar_margin(this_00);
      fVar7 = GetScrollbarSize(this,(uint)(traversable_track_1 == 0.0));
      fVar6 = Math::Max<float>(fVar6,fVar7);
      pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
               operator->(&this->scrollbars[(int)traversable_track_1].widget);
      stack0xffffffffffffffc0 = _traversable_track;
      WidgetScroll::FormatElements(pWVar2,_traversable_track,fVar5 - fVar6);
      offset.x = (float)(uint)(traversable_track_1 != 0.0);
      local_4c = Box::GetPosition((Box *)containing_block,Padding);
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&traversable_track);
      fVar5 = pfVar3[(int)offset.x];
      pBVar4 = Element::GetBox(this->scrollbars[(int)traversable_track_1].element);
      local_54 = Box::GetSize(pBVar4,Border);
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_54);
      fVar6 = pfVar3[(int)offset.x];
      pBVar4 = Element::GetBox(this->scrollbars[(int)traversable_track_1].element);
      fVar7 = Box::GetEdge(pBVar4,Margin,Bottom - (traversable_track_1 == 0.0));
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
      pfVar3[(int)offset.x] = pfVar3[(int)offset.x] + (fVar5 - (fVar6 + fVar7));
      pBVar4 = Element::GetBox(this->scrollbars[(int)traversable_track_1].element);
      fVar5 = Box::GetEdge(pBVar4,Margin,
                           (uint)(traversable_track_1 != 0.0) +
                           (uint)(traversable_track_1 != 0.0) * 2);
      pfVar3 = Vector2::operator_cast_to_float_((Vector2 *)&local_4c);
      pfVar3[1 - (int)offset.x] = pfVar3[1 - (int)offset.x] + fVar5;
      corner_box.area_edges[2][2] = local_4c.x;
      corner_box.area_edges[2][3] = local_4c.y;
      Element::SetOffset(this->scrollbars[(int)traversable_track_1].element,local_4c,this->element,
                         true);
    }
  }
  if (((this->scrollbars[0].enabled & 1U) != 0) && ((this->scrollbars[1].enabled & 1U) != 0)) {
    CreateCorner(this);
    Box::Box((Box *)local_98);
    Vector2<float>::Vector2(&local_a0,traversable_track);
    LayoutDetails::BuildBox((Box *)local_98,local_a0,this->corner,Block);
    Vector2<float>::Vector2(local_b4,this->scrollbars[0].size,this->scrollbars[1].size);
    Box::SetContent((Box *)local_98,local_b4[0]);
    Element::SetBox(this->corner,(Box *)local_98);
    pEVar1 = this->corner;
    local_d4 = Box::GetPosition((Box *)containing_block,Padding);
    local_cc = Vector2<float>::operator+((Vector2<float> *)&traversable_track,local_d4);
    Vector2<float>::Vector2(&local_dc,this->scrollbars[0].size,this->scrollbars[1].size);
    local_c4 = Vector2<float>::operator-(&local_cc,local_dc);
    local_e4 = Box::GetPosition((Box *)local_98,Margin);
    local_bc = Vector2<float>::operator-(&local_c4,local_e4);
    Element::SetOffset(pEVar1,local_bc,this->element,true);
    pEVar1 = this->corner;
    Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_138,Visible);
    Element::SetProperty(pEVar1,Visibility,&local_138);
    Property::~Property(&local_138);
    Box::~Box((Box *)local_98);
  }
  return;
}

Assistant:

void ElementScroll::FormatScrollbars()
{
	const Box& element_box = element->GetBox();
	const Vector2f containing_block = element_box.GetSize(BoxArea::Padding);

	for (int i = 0; i < 2; i++)
	{
		if (!scrollbars[i].enabled)
			continue;

		if (i == VERTICAL)
		{
			scrollbars[i].widget->SetBarLength(element->GetClientHeight());
			scrollbars[i].widget->SetTrackLength(element->GetScrollHeight());

			float traversable_track = element->GetScrollHeight() - element->GetClientHeight();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollTop() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}
		else
		{
			scrollbars[i].widget->SetBarLength(element->GetClientWidth());
			scrollbars[i].widget->SetTrackLength(element->GetScrollWidth());

			float traversable_track = element->GetScrollWidth() - element->GetClientWidth();
			if (traversable_track > 0)
				scrollbars[i].widget->SetBarPosition(element->GetScrollLeft() / traversable_track);
			else
				scrollbars[i].widget->SetBarPosition(0);
		}

		float slider_length = containing_block[1 - i];
		float user_scrollbar_margin = scrollbars[i].element->GetComputedValues().scrollbar_margin();
		float min_scrollbar_margin = GetScrollbarSize(i == VERTICAL ? HORIZONTAL : VERTICAL);
		slider_length -= Math::Max(user_scrollbar_margin, min_scrollbar_margin);

		scrollbars[i].widget->FormatElements(containing_block, slider_length);

		int variable_axis = i == VERTICAL ? 0 : 1;
		Vector2f offset = element_box.GetPosition(BoxArea::Padding);
		offset[variable_axis] += containing_block[variable_axis] -
			(scrollbars[i].element->GetBox().GetSize(BoxArea::Border)[variable_axis] +
				scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Right : BoxEdge::Bottom));
		// Add the top or left margin (as appropriate) onto the scrollbar's position.
		offset[1 - variable_axis] += scrollbars[i].element->GetBox().GetEdge(BoxArea::Margin, i == VERTICAL ? BoxEdge::Top : BoxEdge::Left);
		scrollbars[i].element->SetOffset(offset, element, true);
	}

	// Format the corner, if it is necessary.
	if (scrollbars[0].enabled && scrollbars[1].enabled)
	{
		CreateCorner();

		Box corner_box;
		LayoutDetails::BuildBox(corner_box, Vector2f(containing_block.x), corner);

		corner_box.SetContent(Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size));
		corner->SetBox(corner_box);
		corner->SetOffset(containing_block + element_box.GetPosition(BoxArea::Padding) -
				Vector2f(scrollbars[VERTICAL].size, scrollbars[HORIZONTAL].size) - corner_box.GetPosition(BoxArea::Margin),
			element, true);

		corner->SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));
	}
}